

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O1

void Ivy_ManHaigSimulate(Ivy_Man_t *p)

{
  byte *pbVar1;
  int iVar2;
  Ivy_Man_t *p_00;
  void *pvVar3;
  Ivy_Init_t IVar4;
  Ivy_Init_t IVar5;
  Vec_Int_t *__ptr;
  long lVar6;
  Vec_Ptr_t *pVVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  void *pvVar11;
  Vec_Int_t *vLatches;
  Vec_Int_t *local_40;
  int local_34;
  
  Ivy_ManCheckChoices(p);
  p_00 = p->pHaig;
  if (p_00 == (Ivy_Man_t *)0x0) {
    __assert_fail("p->pHaig != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyHaig.c"
                  ,0x1c4,"void Ivy_ManHaigSimulate(Ivy_Man_t *)");
  }
  __ptr = Ivy_ManDfsSeq(p_00,&local_40);
  *(uint *)&p_00->pConst1->field_0x8 = *(uint *)&p_00->pConst1->field_0x8 & 0xfffff9ff | 0x400;
  pVVar7 = p_00->vPis;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      *(uint *)((long)pVVar7->pArray[lVar6] + 8) =
           *(uint *)((long)pVVar7->pArray[lVar6] + 8) & 0xfffff9ff | 0x200;
      lVar6 = lVar6 + 1;
      pVVar7 = p_00->vPis;
    } while (lVar6 < pVVar7->nSize);
  }
  if (0 < local_40->nSize) {
    lVar6 = 0;
    do {
      iVar2 = local_40->pArray[lVar6];
      if (((long)iVar2 < 0) || (p_00->vObjs->nSize <= iVar2)) goto LAB_0079fc8f;
      pvVar3 = p_00->vObjs->pArray[iVar2];
      if (pvVar3 == (void *)0x0) break;
      pbVar1 = (byte *)((long)pvVar3 + 9);
      *pbVar1 = *pbVar1 | 6;
      lVar6 = lVar6 + 1;
    } while (lVar6 < local_40->nSize);
  }
  pvVar3 = p_00->pData;
  if (0 < *(int *)((long)pvVar3 + 4)) {
    lVar6 = 0;
    do {
      iVar2 = *(int *)(*(long *)((long)pvVar3 + 8) + lVar6 * 4);
      if (((long)iVar2 < 0) || (p_00->vObjs->nSize <= iVar2)) {
LAB_0079fc8f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar11 = p_00->vObjs->pArray[iVar2];
      if (pvVar11 == (void *)0x0) break;
      *(uint *)((long)pvVar11 + 8) = *(uint *)((long)pvVar11 + 8) & 0xfffff9ff | 0x200;
      lVar6 = lVar6 + 1;
    } while (lVar6 < *(int *)((long)pvVar3 + 4));
  }
  uVar10 = 0;
  do {
    uVar8 = 0;
    if (0 < (long)local_40->nSize) {
      lVar6 = 0;
      uVar8 = 0;
      do {
        iVar2 = local_40->pArray[lVar6];
        if (((long)iVar2 < 0) || (p_00->vObjs->nSize <= iVar2)) goto LAB_0079fc8f;
        pvVar3 = p_00->vObjs->pArray[iVar2];
        if (pvVar3 == (void *)0x0) break;
        uVar8 = (ulong)((int)uVar8 + (uint)((~*(uint *)((long)pvVar3 + 8) & 0x600) == 0));
        lVar6 = lVar6 + 1;
      } while (local_40->nSize != lVar6);
    }
    local_34 = (int)uVar10;
    printf("Iter %d : Non-determinate = %d\n",uVar10,uVar8);
    if (0 < __ptr->nSize) {
      lVar6 = 0;
      do {
        iVar2 = __ptr->pArray[lVar6];
        if (((long)iVar2 < 0) || (p_00->vObjs->nSize <= iVar2)) goto LAB_0079fc8f;
        pvVar3 = p_00->vObjs->pArray[iVar2];
        if (pvVar3 == (void *)0x0) break;
        IVar4 = Ivy_InitNotCond(*(uint *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 8
                                         ) >> 9 & IVY_INIT_DC,
                                (uint)*(ulong *)((long)pvVar3 + 0x10) & 1);
        IVar5 = Ivy_InitNotCond(*(uint *)((*(ulong *)((long)pvVar3 + 0x18) & 0xfffffffffffffffe) + 8
                                         ) >> 9 & IVY_INIT_DC,
                                (uint)*(ulong *)((long)pvVar3 + 0x18) & 1);
        uVar9 = (uint)(IVar5 == IVY_INIT_1 && IVar4 == IVY_INIT_1) * 0x200 + 0x200;
        if (IVar5 == IVY_INIT_DC) {
          uVar9 = 0x600;
        }
        if (IVar4 == IVY_INIT_DC) {
          uVar9 = 0x600;
        }
        *(uint *)((long)pvVar3 + 8) = *(uint *)((long)pvVar3 + 8) & 0xfffff9ff | uVar9;
        pvVar11 = *(void **)((long)pvVar3 + 0x48);
        if ((pvVar11 != (void *)0x0) && (0 < *(int *)((long)pvVar3 + 0xc))) {
          if (((ulong)pvVar11 & 1) != 0) {
            __assert_fail("!Ivy_IsComplement(pObj->pEquiv)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyHaig.c"
                          ,0x1f6,"void Ivy_ManHaigSimulate(Ivy_Man_t *)");
          }
          if (pvVar11 != pvVar3) {
            IVar4 = uVar9 >> 9;
            do {
              IVar5 = Ivy_InitNotCond(*(uint *)((long)pvVar11 + 8) >> 9 & IVY_INIT_DC,
                                      *(uint *)((long)pvVar11 + 0x48) & 1);
              if ((IVar5 == IVY_INIT_1 && IVar4 == IVY_INIT_0) ||
                 (IVar5 == IVY_INIT_0 && IVar4 == IVY_INIT_1)) {
                puts("Compatibility fails.");
                IVar4 = IVY_INIT_0;
              }
              else if (IVar4 == IVY_INIT_DC) {
                IVar4 = IVar5;
              }
              pvVar11 = (void *)(*(ulong *)((long)pvVar11 + 0x48) & 0xfffffffffffffffe);
            } while (pvVar3 != pvVar11);
            uVar9 = (IVar4 & IVY_INIT_DC) << 9;
          }
          *(uint *)((long)pvVar3 + 8) = *(uint *)((long)pvVar3 + 8) & 0xfffff9ff | uVar9;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < __ptr->nSize);
    }
    if (0 < local_40->nSize) {
      lVar6 = 0;
      do {
        iVar2 = local_40->pArray[lVar6];
        if (((long)iVar2 < 0) || (p_00->vObjs->nSize <= iVar2)) goto LAB_0079fc8f;
        pvVar3 = p_00->vObjs->pArray[iVar2];
        if (pvVar3 == (void *)0x0) break;
        *(uint *)((long)pvVar3 + 8) =
             (*(uint *)((long)pvVar3 + 8) & 0x7ff) +
             (*(uint *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 8) & 0x600) * 4;
        lVar6 = lVar6 + 1;
      } while (lVar6 < local_40->nSize);
    }
    if (0 < local_40->nSize) {
      lVar6 = 0;
      do {
        iVar2 = local_40->pArray[lVar6];
        if (((long)iVar2 < 0) || (p_00->vObjs->nSize <= iVar2)) goto LAB_0079fc8f;
        pvVar3 = p_00->vObjs->pArray[iVar2];
        if (pvVar3 == (void *)0x0) break;
        *(uint *)((long)pvVar3 + 8) =
             *(uint *)((long)pvVar3 + 8) & 0x1ff | *(uint *)((long)pvVar3 + 8) >> 2 & 0x600;
        lVar6 = lVar6 + 1;
      } while (lVar6 < local_40->nSize);
    }
    uVar10 = (ulong)(local_34 + 1U);
    if (local_34 + 1U == 10) {
      if (__ptr->pArray != (int *)0x0) {
        free(__ptr->pArray);
        __ptr->pArray = (int *)0x0;
      }
      if (__ptr != (Vec_Int_t *)0x0) {
        free(__ptr);
      }
      if (local_40->pArray != (int *)0x0) {
        free(local_40->pArray);
        local_40->pArray = (int *)0x0;
      }
      if (local_40 != (Vec_Int_t *)0x0) {
        free(local_40);
      }
      return;
    }
  } while( true );
}

Assistant:

void Ivy_ManHaigSimulate( Ivy_Man_t * p )
{
    Vec_Int_t * vNodes, * vLatches, * vLatchesD;
    Ivy_Obj_t * pObj, * pTemp;
    Ivy_Init_t In0, In1;
    int i, k, Counter;
    int fVerbose = 0;

    // check choices
    Ivy_ManCheckChoices( p );

    // switch to HAIG
    assert( p->pHaig != NULL );
    p = p->pHaig;

if ( fVerbose )
Ivy_ManForEachPi( p, pObj, i )
printf( "Setting PI %d\n", pObj->Id );

    // collect latches and nodes in the DFS order
    vNodes = Ivy_ManDfsSeq( p, &vLatches );

if ( fVerbose )
Ivy_ManForEachNodeVec( p, vNodes, pObj, i )
printf( "Collected node %d with fanins %d and %d\n", pObj->Id, Ivy_ObjFanin0(pObj)->Id, Ivy_ObjFanin1(pObj)->Id );

    // set the PI values
    Ivy_ManConst1(p)->Init = IVY_INIT_1;
    Ivy_ManForEachPi( p, pObj, i )
        pObj->Init = IVY_INIT_0;

    // set the latch values
    Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
        pObj->Init = IVY_INIT_DC;
    // set the latches of D to be determinate
    vLatchesD = (Vec_Int_t *)p->pData;
    Ivy_ManForEachNodeVec( p, vLatchesD, pObj, i )
        pObj->Init = IVY_INIT_0;

    // perform several rounds of simulation
    for ( k = 0; k < 10; k++ )
    {
        // count the number of non-determinate values
        Counter = 0;
        Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
            Counter += ( pObj->Init == IVY_INIT_DC );
        printf( "Iter %d : Non-determinate = %d\n", k, Counter );    
        
        // simulate the internal nodes
        Ivy_ManForEachNodeVec( p, vNodes, pObj, i )
        {
if ( fVerbose )
printf( "Processing node %d with fanins %d and %d\n", pObj->Id, Ivy_ObjFanin0(pObj)->Id, Ivy_ObjFanin1(pObj)->Id );
            In0 = Ivy_InitNotCond( (Ivy_Init_t)Ivy_ObjFanin0(pObj)->Init, Ivy_ObjFaninC0(pObj) );
            In1 = Ivy_InitNotCond( (Ivy_Init_t)Ivy_ObjFanin1(pObj)->Init, Ivy_ObjFaninC1(pObj) );
            pObj->Init = Ivy_ManHaigSimulateAnd( In0, In1 );
            // simulate the equivalence class if the node is a representative
            if ( pObj->pEquiv && Ivy_ObjRefs(pObj) > 0 )
            {
if ( fVerbose )
printf( "Processing choice node %d\n", pObj->Id );
                In0 = (Ivy_Init_t)pObj->Init;
                assert( !Ivy_IsComplement(pObj->pEquiv) );
                for ( pTemp = pObj->pEquiv; pTemp != pObj; pTemp = Ivy_Regular(pTemp->pEquiv) )
                {
if ( fVerbose )
printf( "Processing secondary node %d\n", pTemp->Id );
                    In1 = Ivy_InitNotCond( (Ivy_Init_t)pTemp->Init, Ivy_IsComplement(pTemp->pEquiv) );
                    In0 = Ivy_ManHaigSimulateChoice( In0, In1 );
                }
                pObj->Init = In0;
            }
        }

        // simulate the latches
        Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
        {
            pObj->Level = Ivy_ObjFanin0(pObj)->Init;
if ( fVerbose )
printf( "Using latch %d with fanin %d\n", pObj->Id, Ivy_ObjFanin0(pObj)->Id );
        }
        Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
            pObj->Init = pObj->Level, pObj->Level = 0;
    }
    // free arrays
    Vec_IntFree( vNodes );
    Vec_IntFree( vLatches );
}